

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O2

void grasshopper_set_encrypt_key(grasshopper_round_keys_t *subkeys,grasshopper_key_t *key)

{
  long lVar1;
  ulong uVar2;
  grasshopper_w128_t local_78;
  grasshopper_w128_t local_68;
  grasshopper_w128_t local_50;
  grasshopper_w128_t local_40;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    local_78.b[lVar1] = (key->k).b[lVar1];
    local_50.b[lVar1] = (key->k).b[lVar1 + 0x10];
  }
  grasshopper_copy128(subkeys->k,&local_78);
  grasshopper_copy128(subkeys->k + 1,&local_50);
  for (uVar2 = 1; (int)uVar2 != 0x21; uVar2 = (ulong)((int)uVar2 + 1)) {
    local_68.q[0] = 0;
    local_68.q[1] = uVar2 << 0x38;
    grasshopper_l(&local_68);
    grasshopper_copy128(&local_40,&local_78);
    grasshopper_append128(&local_40,&local_68);
    grasshopper_convert128(&local_40,grasshopper_pi);
    grasshopper_l(&local_40);
    grasshopper_append128(&local_40,&local_50);
    grasshopper_copy128(&local_50,&local_78);
    grasshopper_copy128(&local_78,&local_40);
    if ((uVar2 & 7) == 0) {
      grasshopper_copy128(subkeys->k + (uVar2 >> 2),&local_78);
      grasshopper_copy128(subkeys->k + ((uint)(uVar2 >> 2) | 1),&local_50);
    }
  }
  return;
}

Assistant:

void grasshopper_set_encrypt_key(grasshopper_round_keys_t* subkeys, const grasshopper_key_t* key) {
    grasshopper_w128_t c, x, y, z;
    int i;

    for (i = 0; i < 16; i++) {
        // this will be have to changed for little-endian systems
        x.b[i] = key->k.b[i];
        y.b[i] = key->k.b[i + 16];
    }

    grasshopper_copy128(&subkeys->k[0], &x);
    grasshopper_copy128(&subkeys->k[1], &y);

    for (i = 1; i <= 32; i++) {

        // C Value
        grasshopper_zero128(&c);
        c.b[15] = (uint8_t) i;        // load round in lsb
        grasshopper_l(&c);

        grasshopper_plus128(&z, &x, &c);
        grasshopper_convert128(&z, grasshopper_pi);
        grasshopper_l(&z);
        grasshopper_append128(&z, &y);

        grasshopper_copy128(&y, &x);
        grasshopper_copy128(&x, &z);

        if ((i & 7) == 0) {
            int k = i >> 2;
            grasshopper_copy128(&subkeys->k[k], &x);
            grasshopper_copy128(&subkeys->k[k + 1], &y);
        }
    }

    // security++
    grasshopper_zero128(&c);
    grasshopper_zero128(&x);
    grasshopper_zero128(&y);
    grasshopper_zero128(&z);
}